

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O2

void __thiscall
TCLAP::Arg::Arg(Arg *this,string *flag,string *name,string *desc,bool req,bool valreq,Visitor *v)

{
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  bool bVar1;
  __type _Var2;
  long lVar3;
  SpecificationException *pSVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string *local_58;
  string local_50;
  
  this->_vptr_Arg = (_func_int **)&PTR__Arg_00133f20;
  local_c0 = &this->_flag;
  std::__cxx11::string::string((string *)local_c0,(string *)flag);
  __lhs = &this->_name;
  std::__cxx11::string::string((string *)__lhs,(string *)name);
  local_58 = &this->_description;
  std::__cxx11::string::string((string *)local_58,(string *)desc);
  this->_required = req;
  std::__cxx11::string::string((string *)&this->_requireLabel,"required",(allocator *)&local_120);
  __lhs_00 = local_c0;
  this->_valueRequired = valreq;
  this->_alreadySet = false;
  this->_visitor = v;
  this->_ignoreable = true;
  this->_xorSet = false;
  this->_acceptsMultipleValues = false;
  if (1 < (this->_flag)._M_string_length) {
    pSVar4 = (SpecificationException *)__cxa_allocate_exception(0x68);
    std::__cxx11::string::string
              ((string *)&local_120,"Argument flag can only be one character long",
               (allocator *)&local_e0);
    (*this->_vptr_Arg[7])(&local_100,this);
    SpecificationException::SpecificationException(pSVar4,&local_120,&local_100);
    __cxa_throw(pSVar4,&SpecificationException::typeinfo,ArgException::~ArgException);
  }
  ignoreNameString_abi_cxx11_();
  bVar1 = std::operator!=(__lhs,&local_120);
  if (!bVar1) {
    std::__cxx11::string::~string((string *)&local_120);
LAB_0010b30e:
    flagStartString_abi_cxx11_();
    std::__cxx11::string::substr((ulong)&local_120,(ulong)__lhs);
    flagStartString_abi_cxx11_();
    _Var2 = std::operator==(&local_120,&local_e0);
    if (_Var2) {
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
    }
    else {
      nameStartString_abi_cxx11_();
      std::__cxx11::string::substr((ulong)&local_98,(ulong)__lhs);
      nameStartString_abi_cxx11_();
      _Var2 = std::operator==(&local_98,&local_78);
      bVar1 = true;
      if (!_Var2) {
        lVar3 = std::__cxx11::string::find((char *)__lhs,0x122444);
        bVar1 = lVar3 != -1;
      }
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
      if (!bVar1) {
        return;
      }
    }
    pSVar4 = (SpecificationException *)__cxa_allocate_exception(0x68);
    flagStartString_abi_cxx11_();
    std::operator+(&local_98,"Argument name begin with either \'",&local_b8);
    std::operator+(&local_e0,&local_98,"\' or \'");
    nameStartString_abi_cxx11_();
    std::operator+(&local_100,&local_e0,&local_78);
    std::operator+(&local_120,&local_100,"\' or space.");
    (*this->_vptr_Arg[7])(&local_50,this);
    SpecificationException::SpecificationException(pSVar4,&local_120,&local_50);
    __cxa_throw(pSVar4,&SpecificationException::typeinfo,ArgException::~ArgException);
  }
  flagStartString_abi_cxx11_();
  _Var2 = std::operator==(__lhs_00,&local_100);
  if (!_Var2) {
    nameStartString_abi_cxx11_();
    _Var2 = std::operator==(__lhs_00,&local_e0);
    if (!_Var2) {
      bVar1 = std::operator==(__lhs_00," ");
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      if (!bVar1) goto LAB_0010b30e;
      goto LAB_0010b56e;
    }
    std::__cxx11::string::~string((string *)&local_e0);
  }
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
LAB_0010b56e:
  pSVar4 = (SpecificationException *)__cxa_allocate_exception(0x68);
  flagStartString_abi_cxx11_();
  std::operator+(&local_98,"Argument flag cannot be either \'",&local_b8);
  std::operator+(&local_e0,&local_98,"\' or \'");
  nameStartString_abi_cxx11_();
  std::operator+(&local_100,&local_e0,&local_78);
  std::operator+(&local_120,&local_100,"\' or a space.");
  (*this->_vptr_Arg[7])(&local_50,this);
  SpecificationException::SpecificationException(pSVar4,&local_120,&local_50);
  __cxa_throw(pSVar4,&SpecificationException::typeinfo,ArgException::~ArgException);
}

Assistant:

inline Arg::Arg(const std::string& flag,
         const std::string& name,
         const std::string& desc,
         bool req,
         bool valreq,
         Visitor* v) :
  _flag(flag),
  _name(name),
  _description(desc),
  _required(req),
  _requireLabel("required"),
  _valueRequired(valreq),
  _alreadySet(false),
  _visitor( v ),
  _ignoreable(true),
  _xorSet(false),
  _acceptsMultipleValues(false)
{
	if ( _flag.length() > 1 )
		throw(SpecificationException(
				"Argument flag can only be one character long", toString() ) );

	if ( _name != ignoreNameString() &&
		 ( _flag == Arg::flagStartString() ||
		   _flag == Arg::nameStartString() ||
		   _flag == " " ) )
		throw(SpecificationException("Argument flag cannot be either '" +
							Arg::flagStartString() + "' or '" +
							Arg::nameStartString() + "' or a space.",
							toString() ) );

	if ( ( _name.substr( 0, Arg::flagStartString().length() ) == Arg::flagStartString() ) ||
		 ( _name.substr( 0, Arg::nameStartString().length() ) == Arg::nameStartString() ) ||
		 ( _name.find( " ", 0 ) != std::string::npos ) )
		throw(SpecificationException("Argument name begin with either '" +
							Arg::flagStartString() + "' or '" +
							Arg::nameStartString() + "' or space.",
							toString() ) );

}